

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::to_resource_register_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,HLSLBindingFlagBits flag,char space,
          uint32_t binding,uint32_t space_set)

{
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  char (*in_stack_ffffffffffffff90) [2];
  allocator local_3d [20];
  allocator local_29;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t space_set_local;
  uint32_t binding_local;
  char space_local;
  CompilerHLSL *pCStack_18;
  HLSLBindingFlagBits flag_local;
  CompilerHLSL *this_local;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,space_set);
  local_28 = space_set;
  local_24 = binding;
  space_set_local._3_1_ = space;
  binding_local = flag;
  pCStack_18 = this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  if ((flag & this->resource_binding_flags) == HLSL_BINDING_AUTO_NONE_BIT) {
    remap_hlsl_resource_binding(this,flag,&local_28,&local_24);
    if ((binding_local == 1) && (local_28 == 0xffffffff)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
    else if ((this->hlsl_options).shader_model < 0x33) {
      join<char_const(&)[13],char&,unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)" : register(",
                 (char (*) [13])((long)&space_set_local + 3),(char *)&local_24,(uint *)0x5b7d4b,ts_3
                );
    }
    else {
      join<char_const(&)[13],char&,unsigned_int&,char_const(&)[8],unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)" : register(",
                 (char (*) [13])((long)&space_set_local + 3),(char *)&local_24,(uint *)", space",
                 (char (*) [8])&local_28,(uint *)0x5b7d4b,in_stack_ffffffffffffff90);
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_3d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_3d);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_resource_register(HLSLBindingFlagBits flag, char space, uint32_t binding, uint32_t space_set)
{
	if ((flag & resource_binding_flags) == 0)
	{
		remap_hlsl_resource_binding(flag, space_set, binding);

		// The push constant block did not have a binding, and there were no remap for it,
		// so, declare without register binding.
		if (flag == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT && space_set == ResourceBindingPushConstantDescriptorSet)
			return "";

		if (hlsl_options.shader_model >= 51)
			return join(" : register(", space, binding, ", space", space_set, ")");
		else
			return join(" : register(", space, binding, ")");
	}
	else
		return "";
}